

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O1

bool __thiscall Moc::parseClassHead(Moc *this,ClassDef *def)

{
  QByteArray *args;
  long lVar1;
  Symbol *pSVar2;
  long lVar3;
  Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *this_00;
  undefined8 uVar4;
  undefined8 uVar5;
  Data *pDVar6;
  char *pcVar7;
  Access AVar8;
  bool bVar9;
  long lVar10;
  QByteArray *pQVar11;
  Node<QByteArray,_QByteArray> *pNVar12;
  Token *pTVar13;
  Access AVar14;
  Token TVar15;
  long in_FS_OFFSET;
  Type type;
  undefined1 local_d8 [56];
  undefined1 *puStack_a0;
  char *local_98;
  char *local_90;
  QByteArray local_88;
  SuperClass local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar10 = (this->super_Parser).index;
  pTVar13 = &(this->super_Parser).symbols.d.ptr[lVar10 + -1].token;
  lVar10 = lVar10 + -1;
  do {
    do {
      TVar15 = NOTOKEN;
      if (lVar10 < (this->super_Parser).symbols.d.size) {
        TVar15 = *pTVar13;
      }
      pTVar13 = pTVar13 + 0xc;
      lVar10 = lVar10 + 1;
    } while (COLON < TVar15);
    if ((0x84001U >> (TVar15 & TRY) & 1) != 0) {
      skipCxxAttributes(this);
      lVar10 = (this->super_Parser).index;
      if ((lVar10 < (this->super_Parser).symbols.d.size) &&
         ((this->super_Parser).symbols.d.ptr[lVar10].token == IDENTIFIER)) {
        (this->super_Parser).index = lVar10 + 1;
        local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_88.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray::mid((longlong)&local_88,
                        (longlong)&(this->super_Parser).symbols.d.ptr[lVar10].lex);
        lVar10 = (this->super_Parser).symbols.d.size;
        lVar1 = (this->super_Parser).index;
        if ((lVar1 < lVar10) && ((this->super_Parser).symbols.d.ptr[lVar1].token == LPAREN)) {
          (this->super_Parser).index = lVar1 + 1;
          until(this,PP_RPAREN);
          lVar10 = (this->super_Parser).index;
          if (((this->super_Parser).symbols.d.size <= lVar10) ||
             ((this->super_Parser).symbols.d.ptr[lVar10].token != IDENTIFIER)) goto LAB_001158ae;
          (this->super_Parser).index = lVar10 + 1;
          QByteArray::mid((longlong)local_d8,
                          (longlong)&(this->super_Parser).symbols.d.ptr[lVar10].lex);
          pcVar7 = local_88.d.ptr;
          uVar5 = local_d8._16_8_;
          uVar4 = local_d8._0_8_;
          local_d8._0_8_ = local_88.d.d;
          local_88.d.d = (Data *)uVar4;
          local_88.d.ptr = (char *)local_d8._8_8_;
          local_d8._8_8_ = pcVar7;
          local_d8._16_8_ = local_88.d.size;
          local_88.d.size = uVar5;
LAB_0011533f:
          if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_d8._0_8_,1,0x10);
            }
          }
        }
        else {
          lVar1 = (this->super_Parser).index;
          if ((lVar1 < lVar10) && ((this->super_Parser).symbols.d.ptr[lVar1].token == IDENTIFIER)) {
            (this->super_Parser).index = lVar1 + 1;
            local_d8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QByteArray::mid((longlong)local_d8,
                            (longlong)&(this->super_Parser).symbols.d.ptr[lVar1].lex);
            local_70.classname.d.d = (Data *)0x141c7c;
            bVar9 = operator!=((QByteArray *)local_d8,(char **)&local_70);
            if (bVar9) {
              local_90 = "sealed";
              bVar9 = operator!=((QByteArray *)local_d8,&local_90);
              if (bVar9) {
                local_98 = "Q_DECL_FINAL";
                bVar9 = operator!=((QByteArray *)local_d8,&local_98);
                if (bVar9) {
                  QByteArray::operator=(&local_88,(QByteArray *)local_d8);
                }
              }
            }
            goto LAB_0011533f;
          }
        }
        args = &(def->super_BaseDef).qualified;
        QByteArray::append(args);
        lVar10 = (this->super_Parser).index;
        if (lVar10 < (this->super_Parser).symbols.d.size) goto LAB_00115383;
        goto LAB_00115499;
      }
      break;
    }
  } while ((0x40100U >> (TVar15 & TRY) & 1) == 0);
  bVar9 = false;
  goto LAB_00115251;
  while( true ) {
    (this->super_Parser).index = lVar10 + 1;
    QByteArray::mid((longlong)local_d8,(longlong)&(this->super_Parser).symbols.d.ptr[lVar10].lex);
    QByteArray::append(args);
    if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_d8._0_8_,1,0x10);
      }
    }
    lVar10 = (this->super_Parser).index;
    if ((lVar10 < (this->super_Parser).symbols.d.size) &&
       ((this->super_Parser).symbols.d.ptr[lVar10].token == IDENTIFIER)) {
      (this->super_Parser).index = lVar10 + 1;
      QByteArray::mid((longlong)local_d8,(longlong)&(this->super_Parser).symbols.d.ptr[lVar10].lex);
      pcVar7 = local_88.d.ptr;
      pDVar6 = local_88.d.d;
      uVar5 = local_d8._16_8_;
      uVar4 = local_d8._0_8_;
      local_d8._0_8_ = local_88.d.d;
      local_88.d.d = (Data *)uVar4;
      local_88.d.ptr = (char *)local_d8._8_8_;
      local_d8._8_8_ = pcVar7;
      local_d8._16_8_ = local_88.d.size;
      local_88.d.size = uVar5;
      if (&pDVar6->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar6->super_QArrayData,1,0x10);
        }
      }
      QByteArray::append(args);
    }
    lVar10 = (this->super_Parser).index;
    if ((this->super_Parser).symbols.d.size <= lVar10) break;
LAB_00115383:
    if ((this->super_Parser).symbols.d.ptr[lVar10].token != SCOPE) break;
  }
LAB_00115499:
  QByteArray::operator=((QByteArray *)def,&local_88);
  pSVar2 = (this->super_Parser).symbols.d.ptr;
  lVar10 = (this->super_Parser).index;
  (def->super_BaseDef).lineNumber = (long)pSVar2[lVar10 + -1].lineNum;
  if ((lVar10 < (this->super_Parser).symbols.d.size) && (pSVar2[lVar10].token == IDENTIFIER)) {
    (this->super_Parser).index = lVar10 + 1;
    local_d8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::mid((longlong)local_d8,(longlong)&pSVar2[lVar10].lex);
    local_70.classname.d.d = (Data *)0x141c7c;
    bVar9 = operator!=((QByteArray *)local_d8,(char **)&local_70);
    if (!bVar9) {
LAB_00115591:
      if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_d8._0_8_,1,0x10);
        }
      }
      goto LAB_001155b2;
    }
    local_90 = "sealed";
    bVar9 = operator!=((QByteArray *)local_d8,&local_90);
    if (!bVar9) goto LAB_00115591;
    local_98 = "Q_DECL_FINAL";
    bVar9 = operator!=((QByteArray *)local_d8,&local_98);
    if (!bVar9) goto LAB_00115591;
    if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_d8._0_8_,1,0x10);
      }
    }
LAB_001158ae:
    bVar9 = false;
  }
  else {
LAB_001155b2:
    lVar10 = (this->super_Parser).index;
    if ((lVar10 < (this->super_Parser).symbols.d.size) &&
       ((this->super_Parser).symbols.d.ptr[lVar10].token == COLON)) {
      do {
        lVar1 = lVar10 + 1;
        (this->super_Parser).index = lVar1;
        lVar3 = (this->super_Parser).symbols.d.size;
        if ((lVar1 < lVar3) && ((this->super_Parser).symbols.d.ptr[lVar1].token == VIRTUAL)) {
          (this->super_Parser).index = lVar10 + 2;
        }
        lVar10 = (this->super_Parser).index;
        if (((lVar10 < lVar3) &&
            (AVar8 = Private, (this->super_Parser).symbols.d.ptr[lVar10].token == PRIVATE)) ||
           ((lVar10 = (this->super_Parser).index, lVar10 < lVar3 &&
            (AVar8 = Protected, (this->super_Parser).symbols.d.ptr[lVar10].token == PROTECTED)))) {
LAB_0011566d:
          AVar14 = AVar8;
          (this->super_Parser).index = lVar10 + 1;
        }
        else {
          lVar10 = (this->super_Parser).index;
          AVar14 = Public;
          if ((lVar10 < lVar3) &&
             (AVar8 = Public, (this->super_Parser).symbols.d.ptr[lVar10].token == PUBLIC))
          goto LAB_0011566d;
        }
        lVar10 = (this->super_Parser).index;
        if ((lVar10 < lVar3) && ((this->super_Parser).symbols.d.ptr[lVar10].token == VIRTUAL)) {
          (this->super_Parser).index = lVar10 + 1;
        }
        local_d8._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
        puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
        local_d8._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_d8._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_d8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_d8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        parseType((Type *)local_d8,this);
        lVar10 = (this->super_Parser).index;
        if ((lVar10 < (this->super_Parser).symbols.d.size) &&
           ((this->super_Parser).symbols.d.ptr[lVar10].token == LPAREN)) {
          (this->super_Parser).index = lVar10 + 1;
          until(this,PP_RPAREN);
        }
        else {
          local_70.classname.d.d = (Data *)local_d8._0_8_;
          local_70.classname.d.ptr = (char *)local_d8._8_8_;
          local_70.classname.d.size = local_d8._16_8_;
          if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pQVar11 = toFullyQualified(this,(QByteArray *)local_d8);
          local_70.qualified.d.d = (pQVar11->d).d;
          local_70.qualified.d.ptr = (pQVar11->d).ptr;
          local_70.qualified.d.size = (pQVar11->d).size;
          if (&(local_70.qualified.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&((local_70.qualified.d.d)->super_QArrayData).ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((local_70.qualified.d.d)->super_QArrayData).ref_)->ref_)._q_value
                 .super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_70.access = AVar14;
          QtPrivate::QMovableArrayOps<SuperClass>::emplace<SuperClass>
                    ((QMovableArrayOps<SuperClass> *)&def->superclassList,
                     (def->superclassList).d.size,&local_70);
          QList<SuperClass>::end(&def->superclassList);
          if (&(local_70.qualified.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_70.qualified.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_70.qualified.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_70.qualified.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_70.qualified.d.d)->super_QArrayData,1,0x10);
            }
          }
          if (&(local_70.classname.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_70.classname.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_70.classname.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_70.classname.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_70.classname.d.d)->super_QArrayData,1,0x10);
            }
          }
        }
        if ((QArrayData *)local_d8._24_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_d8._24_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_d8._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_d8._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_d8._24_8_,1,0x10);
          }
        }
        if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_d8._0_8_,1,0x10);
          }
        }
        lVar10 = (this->super_Parser).index;
      } while ((lVar10 < (this->super_Parser).symbols.d.size) &&
              ((this->super_Parser).symbols.d.ptr[lVar10].token == COMMA));
      if (((def->superclassList).d.size != 0) &&
         ((this_00 = (this->knownGadgets).d,
          this_00 != (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0 &&
          (pNVar12 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::
                     findNode<QByteArray>(this_00,&((def->superclassList).d.ptr)->classname),
          pNVar12 != (Node<QByteArray,_QByteArray> *)0x0)))) {
        QHash<QByteArray,QByteArray>::emplace<QByteArray_const&>
                  ((QHash<QByteArray,QByteArray> *)&this->knownGadgets,(QByteArray *)def,args);
        QHash<QByteArray,QByteArray>::emplace<QByteArray_const&>
                  ((QHash<QByteArray,QByteArray> *)&this->knownGadgets,args,args);
      }
    }
    lVar10 = (this->super_Parser).index;
    if (((this->super_Parser).symbols.d.size <= lVar10) ||
       ((this->super_Parser).symbols.d.ptr[lVar10].token != LBRACE)) goto LAB_001158ae;
    (this->super_Parser).index = lVar10 + 1;
    (def->super_BaseDef).begin = lVar10;
    bVar9 = until(this,RBRACE);
    (def->super_BaseDef).end = (this->super_Parser).index;
    (this->super_Parser).index = (def->super_BaseDef).begin + 1;
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
    }
  }
LAB_00115251:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

bool Moc::parseClassHead(ClassDef *def)
{
    // figure out whether this is a class declaration, or only a
    // forward or variable declaration.
    int i = 0;
    Token token;
    do {
        token = lookup(i++);
        if (token == COLON || token == LBRACE)
            break;
        if (token == SEMIC || token == RANGLE)
            return false;
    } while (token);

    // support attributes like "class [[deprecated]]] name"
    skipCxxAttributes();

    if (!test(IDENTIFIER)) // typedef struct { ... }
        return false;
    QByteArray name = lexem();

    // support "class IDENT name" and "class IDENT(IDENT) name"
    // also support "class IDENT name (final|sealed|Q_DECL_FINAL)"
    if (test(LPAREN)) {
        until(RPAREN);
        if (!test(IDENTIFIER))
            return false;
        name = lexem();
    } else  if (test(IDENTIFIER)) {
        const QByteArray lex = lexem();
        if (lex != "final" && lex != "sealed" && lex != "Q_DECL_FINAL")
            name = lex;
    }

    def->qualified += name;
    while (test(SCOPE)) {
        def->qualified += lexem();
        if (test(IDENTIFIER)) {
            name = lexem();
            def->qualified += name;
        }
    }
    def->classname = name;
    def->lineNumber = symbol().lineNum;

    if (test(IDENTIFIER)) {
        const QByteArray lex = lexem();
        if (lex != "final" && lex != "sealed" && lex != "Q_DECL_FINAL")
            return false;
    }

    if (test(COLON)) {
        do {
            test(VIRTUAL);
            FunctionDef::Access access = FunctionDef::Public;
            if (test(PRIVATE))
                access = FunctionDef::Private;
            else if (test(PROTECTED))
                access = FunctionDef::Protected;
            else
                test(PUBLIC);
            test(VIRTUAL);
            const Type type = parseType();
            // ignore the 'class Foo : BAR(Baz)' case
            if (test(LPAREN)) {
                until(RPAREN);
            } else {
                def->superclassList.push_back({type.name, toFullyQualified(type.name), access});
            }
        } while (test(COMMA));

        if (!def->superclassList.isEmpty()
            && knownGadgets.contains(def->superclassList.constFirst().classname)) {
            // Q_GADGET subclasses are treated as Q_GADGETs
            knownGadgets.insert(def->classname, def->qualified);
            knownGadgets.insert(def->qualified, def->qualified);
        }
    }
    if (!test(LBRACE))
        return false;
    def->begin = index - 1;
    bool foundRBrace = until(RBRACE);
    def->end = index;
    index = def->begin + 1;
    return foundRBrace;
}